

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall
dxil_spv::Converter::Impl::type_can_relax_precision(Impl *this,Type *type,bool known_integer_sign)

{
  TypeID TVar1;
  uint uVar2;
  ArrayType *this_00;
  VectorType *this_01;
  byte local_33;
  byte local_32;
  byte local_31;
  Type *pTStack_20;
  bool known_integer_sign_local;
  Type *type_local;
  Impl *this_local;
  
  if (((this->options).arithmetic_relaxed_precision & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    TVar1 = LLVMBC::Type::getTypeID(type);
    pTStack_20 = type;
    if (TVar1 == ArrayTyID) {
      this_00 = LLVMBC::cast<LLVMBC::ArrayType>(type);
      pTStack_20 = LLVMBC::Type::getArrayElementType(&this_00->super_Type);
    }
    TVar1 = LLVMBC::Type::getTypeID(pTStack_20);
    if (TVar1 == VectorTyID) {
      this_01 = LLVMBC::cast<LLVMBC::VectorType>(pTStack_20);
      pTStack_20 = LLVMBC::VectorType::getElementType(this_01);
    }
    local_31 = 0;
    if ((((this->execution_mode_meta).native_16bit_operations & 1U) == 0) &&
       (local_31 = 0, ((this->options).min_precision_prefer_native_16bit & 1U) == 0)) {
      TVar1 = LLVMBC::Type::getTypeID(pTStack_20);
      local_32 = 1;
      if (TVar1 != HalfTyID) {
        TVar1 = LLVMBC::Type::getTypeID(pTStack_20);
        local_33 = 0;
        if (TVar1 == IntegerTyID) {
          uVar2 = LLVMBC::Type::getIntegerBitWidth(pTStack_20);
          local_33 = 0;
          if (uVar2 == 0x10) {
            local_33 = known_integer_sign;
          }
        }
        local_32 = local_33;
      }
      local_31 = local_32;
    }
    this_local._7_1_ = (bool)(local_31 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::type_can_relax_precision(const llvm::Type *type, bool known_integer_sign) const
{
	if (!options.arithmetic_relaxed_precision)
		return false;

	if (type->getTypeID() == llvm::Type::TypeID::ArrayTyID)
		type = llvm::cast<llvm::ArrayType>(type)->getArrayElementType();
	if (type->getTypeID() == llvm::Type::TypeID::VectorTyID)
		type = llvm::cast<llvm::VectorType>(type)->getElementType();

	return (!execution_mode_meta.native_16bit_operations && !options.min_precision_prefer_native_16bit) &&
	       (type->getTypeID() == llvm::Type::TypeID::HalfTyID ||
	        (type->getTypeID() == llvm::Type::TypeID::IntegerTyID && type->getIntegerBitWidth() == 16 &&
	         known_integer_sign));
}